

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<long,_10> * __thiscall
TPZManVector<long,_10>::operator=(TPZManVector<long,_10> *this,initializer_list<long> *list)

{
  ulong uVar1;
  long *plVar2;
  size_type sVar3;
  iterator plVar4;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  
  uVar1 = list->_M_len;
  uVar5 = (this->super_TPZVec<long>).fNAlloc;
  if ((uVar5 < uVar1) &&
     (plVar6 = (this->super_TPZVec<long>).fStore, plVar6 != this->fExtAlloc && plVar6 != (long *)0x0
     )) {
    operator_delete__(plVar6);
    uVar5 = 0;
    (this->super_TPZVec<long>).fStore = (long *)0x0;
    (this->super_TPZVec<long>).fNAlloc = 0;
  }
  if (uVar1 < 0xb) {
    plVar2 = (this->super_TPZVec<long>).fStore;
    plVar6 = this->fExtAlloc;
    if (plVar2 != (long *)0x0 && plVar2 != plVar6) {
      operator_delete__(plVar2);
    }
    (this->super_TPZVec<long>).fNAlloc = 0;
    (this->super_TPZVec<long>).fStore = plVar6;
  }
  else {
    if (uVar1 <= uVar5) {
      (this->super_TPZVec<long>).fNElements = uVar1;
      plVar6 = (this->super_TPZVec<long>).fStore;
      goto LAB_00b2b968;
    }
    plVar6 = (long *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    (this->super_TPZVec<long>).fStore = plVar6;
    (this->super_TPZVec<long>).fNAlloc = uVar1;
  }
  (this->super_TPZVec<long>).fNElements = uVar1;
LAB_00b2b968:
  sVar3 = list->_M_len;
  if (sVar3 != 0) {
    plVar4 = list->_M_array;
    lVar7 = 0;
    do {
      *(undefined8 *)((long)plVar6 + lVar7) = *(undefined8 *)((long)plVar4 + lVar7);
      lVar7 = lVar7 + 8;
    } while (sVar3 << 3 != lVar7);
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const std::initializer_list<T>& list) {
	size_t size = list.size();

	if (size > this->fNAlloc && this->fStore && this->fStore != this->fExtAlloc) {
		delete[] this->fStore;
		this->fStore = 0;
		this->fNAlloc = 0;
	}

	if (size <= NumExtAlloc) {
		if (this->fStore != fExtAlloc) {
			delete[]this->fStore;
		}
		this->fNAlloc = 0;
		this->fStore = fExtAlloc;
		this->fNElements = size;
	}
	else if (this->fNAlloc >= size) {
		this->fNElements = size;
	}
	else {
		this->fStore = new T[size];
		this->fNAlloc = size;
		this->fNElements = size;
	}

	auto it_end = list.end();
	T* aux = this->fStore;
	for (auto it = list.begin(); it != it_end; it++, aux++)
		*aux = *it;

	return *this;
}